

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O1

void __thiscall btSymMatrix<int>::resize(btSymMatrix<int> *this,int n,int *init)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  this->dim = n;
  iVar3 = (n + 1) * n;
  iVar7 = iVar3 / 2;
  iVar1 = (this->store).m_size;
  lVar8 = (long)iVar1;
  if ((iVar1 <= iVar7) && (iVar1 < iVar7)) {
    if ((this->store).m_capacity < iVar7) {
      if (iVar3 + 1U < 3) {
        piVar4 = (int *)0x0;
      }
      else {
        piVar4 = (int *)btAlignedAllocInternal((long)iVar7 << 2,0x10);
      }
      lVar5 = (long)(this->store).m_size;
      if (0 < lVar5) {
        piVar2 = (this->store).m_data;
        lVar6 = 0;
        do {
          piVar4[lVar6] = piVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      piVar2 = (this->store).m_data;
      if (piVar2 != (int *)0x0) {
        if ((this->store).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar2);
        }
        (this->store).m_data = (int *)0x0;
      }
      (this->store).m_ownsMemory = true;
      (this->store).m_data = piVar4;
      (this->store).m_capacity = iVar7;
    }
    if (iVar1 < iVar7) {
      piVar4 = (this->store).m_data;
      do {
        piVar4[lVar8] = *init;
        lVar8 = lVar8 + 1;
      } while (iVar7 != lVar8);
    }
  }
  (this->store).m_size = iVar7;
  return;
}

Assistant:

void					resize(int n,const T& init=T())			{ dim=n;store.resize((n*(n+1))/2,init); }